

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim.c
# Opt level: O3

double aom_ssim2(uint8_t *img1,uint8_t *img2,int stride_img1,int stride_img2,int width,int height)

{
  undefined4 in_register_0000000c;
  undefined4 in_register_00000084;
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint32_t sum_r;
  uint local_88;
  uint32_t sum_sq_r;
  uint32_t sum_sq_s;
  uint32_t sum_s;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  uint8_t *local_68;
  long local_60;
  long local_58;
  undefined8 local_50;
  undefined8 local_48;
  uint8_t *local_40;
  double local_38;
  
  local_50 = CONCAT44(in_register_00000084,width);
  local_48 = CONCAT44(in_register_0000000c,stride_img2);
  if (height < 8) {
    return NAN;
  }
  local_78 = height + -8;
  local_70 = width + -8;
  local_58 = (long)(stride_img1 * 4);
  local_60 = (long)(stride_img2 * 4);
  local_38 = 0.0;
  local_6c = 0;
  local_74 = 0;
  local_40 = img2;
  local_68 = img1;
  do {
    if (7 < (int)local_50) {
      lVar1 = 0;
      do {
        sum_s = 0;
        sum_r = 0;
        sum_sq_s = 0;
        sum_sq_r = 0;
        local_88 = 0;
        aom_ssim_parms_8x8_sse2
                  (local_68 + lVar1,stride_img1,local_40 + lVar1,local_48,&sum_s,&sum_r,&sum_sq_s,
                   &sum_sq_r,&local_88);
        dVar3 = (double)sum_s;
        dVar2 = (double)sum_r;
        dVar4 = (dVar3 + dVar3) * dVar2;
        local_38 = local_38 +
                   ((((double)local_88 * 128.0 - dVar4) + 239708.0) * (dVar4 + 26634.0)) /
                   (((((double)sum_sq_r * 64.0 + ((double)sum_sq_s * 64.0 - dVar3 * dVar3)) -
                     dVar2 * dVar2) + 239708.0) * (dVar3 * dVar3 + dVar2 * dVar2 + 26634.0));
        local_6c = local_6c + 1;
        lVar1 = lVar1 + 4;
      } while ((int)lVar1 <= local_70);
    }
    local_74 = local_74 + 4;
    local_68 = local_68 + local_58;
    local_40 = local_40 + local_60;
  } while (local_74 <= local_78);
  return local_38 / (double)local_6c;
}

Assistant:

double aom_ssim2(const uint8_t *img1, const uint8_t *img2, int stride_img1,
                 int stride_img2, int width, int height) {
  int i, j;
  int samples = 0;
  double ssim_total = 0;

  // sample point start with each 4x4 location
  for (i = 0; i <= height - 8;
       i += 4, img1 += stride_img1 * 4, img2 += stride_img2 * 4) {
    for (j = 0; j <= width - 8; j += 4) {
      double v = ssim_8x8(img1 + j, stride_img1, img2 + j, stride_img2);
      ssim_total += v;
      samples++;
    }
  }
  ssim_total /= samples;
  return ssim_total;
}